

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

void save_dungeon(memfile *mf)

{
  int local_20;
  int local_1c;
  int i;
  int count;
  branch *curr;
  memfile *mf_local;
  
  mtag(mf,0,MTAG_DUNGEON);
  mfmagic_set(mf,0x4e4744);
  mwrite32(mf,n_dgns);
  for (local_20 = 0; local_20 < n_dgns; local_20 = local_20 + 1) {
    save_dungeon_struct(mf,dungeons + local_20);
  }
  mwrite(mf,&dungeon_topology,0x3e);
  mwrite(mf,tune,6);
  local_1c = 0;
  for (_i = branches; _i != (branch *)0x0; _i = _i->next) {
    local_1c = local_1c + 1;
  }
  mwrite32(mf,local_1c);
  for (_i = branches; _i != (branch *)0x0; _i = _i->next) {
    save_branch(mf,_i);
  }
  mwrite(mf,&inv_pos,2);
  return;
}

Assistant:

void save_dungeon(struct memfile *mf)
{
    branch *curr;
    int    count, i;

    mtag(mf, 0, MTAG_DUNGEON);
    mfmagic_set(mf, DGN_MAGIC);

    mwrite32(mf, n_dgns);
    for (i = 0; i < n_dgns; i++)
	save_dungeon_struct(mf, &dungeons[i]);

    /* writing dungeon_topology directly should be ok, it's just a
	* fancy collection of single byte values */
    mwrite(mf, &dungeon_topology, sizeof dungeon_topology);
    mwrite(mf, tune, sizeof tune);

    for (count = 0, curr = branches; curr; curr = curr->next)
	count++;
    mwrite32(mf, count);

    for (curr = branches; curr; curr = curr->next)
	save_branch(mf, curr);

    mwrite(mf, &inv_pos, sizeof(coord));
}